

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Marshall.c
# Opt level: O2

WJTL_STATUS TestMarshallStrings(void)

{
  undefined4 uVar1;
  WJTL_STATUS WVar2;
  WJTL_STATUS WVar3;
  WJTL_STATUS WVar4;
  WJTL_STATUS WVar5;
  WJTL_STATUS WVar6;
  WJTL_STATUS WVar7;
  WJTL_STATUS WVar8;
  JL_STATUS JVar9;
  WJTL_STATUS WVar10;
  char *jsonString;
  StringStruct theStruct;
  JlMarshallElement marshalStringStruct [2];
  
  memcpy(marshalStringStruct,&DAT_001419b0,0xc0);
  theStruct.fixedStr[0] = '\0';
  theStruct.fixedStr[1] = '\0';
  theStruct.fixedStr[2] = '\0';
  theStruct.fixedStr[3] = '\0';
  theStruct.fixedStr[4] = '\0';
  theStruct.fixedStr[5] = '\0';
  theStruct.fixedStr[6] = '\0';
  theStruct.fixedStr[7] = '\0';
  theStruct.fixedStr[8] = '\0';
  theStruct.fixedStr[9] = '\0';
  theStruct._10_6_ = 0;
  theStruct.strPtr = (char *)0x0;
  jsonString = (char *)0x0;
  WVar2 = MakeJsonAndVerify(&theStruct,marshalStringStruct,2,"{\"fixedStr\":null,\"strPtr\":null}");
  WjTestLib_Assert(WVar2 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJsonAndVerify( &theStruct, marshalStringStruct, ( sizeof(marshalStringStruct) / sizeof((marshalStringStruct)[0]) ), \"{\\\"fixedStr\\\":null,\\\"strPtr\\\":null}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallStrings",0x7b);
  builtin_strncpy(theStruct.fixedStr,"Hello",6);
  uVar1 = theStruct.fixedStr._0_4_;
  theStruct.fixedStr._0_8_ = CONCAT44(theStruct.fixedStr._4_4_,uVar1);
  theStruct.strPtr = "There";
  WVar3 = MakeJsonAndVerify(&theStruct,marshalStringStruct,2,
                            "{\"fixedStr\":\"Hello\",\"strPtr\":\"There\"}");
  WjTestLib_Assert(WVar3 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJsonAndVerify( &theStruct, marshalStringStruct, ( sizeof(marshalStringStruct) / sizeof((marshalStringStruct)[0]) ), \"{\\\"fixedStr\\\":\\\"Hello\\\",\\\"strPtr\\\":\\\"There\\\"}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallStrings",0x81);
  theStruct.fixedStr._0_8_ = theStruct.fixedStr._0_8_ & 0xffffffffffffff00;
  theStruct.strPtr = "\x01\x02\x03\x04\x05\x06\a\b\t\n\v\f\r\x0e";
  WVar4 = MakeJsonAndVerify(&theStruct,marshalStringStruct,2,
                            "{\"fixedStr\":null,\"strPtr\":\"\\u0001\\u0002\\u0003\\u0004\\u0005\\u0006\\u0007\\b\\t\\n\\u000b\\f\\r\\u000e\"}"
                           );
  WjTestLib_Assert(WVar4 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJsonAndVerify( &theStruct, marshalStringStruct, ( sizeof(marshalStringStruct) / sizeof((marshalStringStruct)[0]) ), \"{\\\"fixedStr\\\":null,\\\"strPtr\\\":\\\"\\\\u0001\\\\u0002\\\\u0003\\\\u0004\\\\u0005\\\\u0006\\\\u0007\\\\b\\\\t\\\\n\\\\u000b\\\\f\\\\r\\\\u000e\\\"}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallStrings",0x87);
  theStruct.strPtr = "\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f";
  WVar5 = MakeJsonAndVerify(&theStruct,marshalStringStruct,2,
                            "{\"fixedStr\":null,\"strPtr\":\"\\u0010\\u0011\\u0012\\u0013\\u0014\\u0015\\u0016\\u0017\\u0018\\u0019\\u001a\\u001b\\u001c\\u001d\\u001e\\u001f\"}"
                           );
  WjTestLib_Assert(WVar5 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJsonAndVerify( &theStruct, marshalStringStruct, ( sizeof(marshalStringStruct) / sizeof((marshalStringStruct)[0]) ), \"{\\\"fixedStr\\\":null,\\\"strPtr\\\":\\\"\\\\u0010\\\\u0011\\\\u0012\\\\u0013\\\\u0014\\\\u0015\\\\u0016\\\\u0017\" \"\\\\u0018\\\\u0019\\\\u001a\\\\u001b\\\\u001c\\\\u001d\\\\u001e\\\\u001f\\\"}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallStrings",0x8c);
  theStruct.strPtr = "_\"_";
  WVar6 = MakeJsonAndVerify(&theStruct,marshalStringStruct,2,
                            "{\"fixedStr\":null,\"strPtr\":\"_\\\"_\"}");
  WjTestLib_Assert(WVar6 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJsonAndVerify( &theStruct, marshalStringStruct, ( sizeof(marshalStringStruct) / sizeof((marshalStringStruct)[0]) ), \"{\\\"fixedStr\\\":null,\\\"strPtr\\\":\\\"_\\\\\\\"_\\\"}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallStrings",0x90);
  theStruct.strPtr = "_\\_";
  WVar7 = MakeJsonAndVerify(&theStruct,marshalStringStruct,2,
                            "{\"fixedStr\":null,\"strPtr\":\"_\\\\_\"}");
  WjTestLib_Assert(WVar7 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJsonAndVerify( &theStruct, marshalStringStruct, ( sizeof(marshalStringStruct) / sizeof((marshalStringStruct)[0]) ), \"{\\\"fixedStr\\\":null,\\\"strPtr\\\":\\\"_\\\\\\\\_\\\"}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallStrings",0x94);
  theStruct.strPtr = anon_var_dwarf_4cd;
  WVar8 = MakeJsonAndVerify(&theStruct,marshalStringStruct,2,anon_var_dwarf_18427);
  WjTestLib_Assert(WVar8 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJsonAndVerify( &theStruct, marshalStringStruct, ( sizeof(marshalStringStruct) / sizeof((marshalStringStruct)[0]) ), \"{\\\"fixedStr\\\":null,\\\"strPtr\\\":\\\"\\xF0\\x9F\\x98\\x81\\\"}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallStrings",0x98);
  theStruct.strPtr = anon_var_dwarf_951c;
  JVar9 = JlStructToJson(&theStruct,marshalStringStruct,2,false,&jsonString);
  WVar10 = WJTL_STATUS_SUCCESS;
  if (JVar9 != JL_STATUS_INVALID_DATA) {
    WVar10 = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(JVar9 == JL_STATUS_INVALID_DATA,
                   "(JlStructToJson( &theStruct, marshalStringStruct, ( sizeof(marshalStringStruct) / sizeof((marshalStringStruct)[0]) ), 0, &jsonString )) == (JL_STATUS_INVALID_DATA)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallStrings",0x9d);
  if (((WVar6 != WJTL_STATUS_SUCCESS || WVar7 != WJTL_STATUS_SUCCESS) ||
      ((WVar4 != WJTL_STATUS_SUCCESS || WVar5 != WJTL_STATUS_SUCCESS) ||
      (WVar3 != WJTL_STATUS_SUCCESS || WVar2 != WJTL_STATUS_SUCCESS))) ||
      WVar8 != WJTL_STATUS_SUCCESS) {
    WVar10 = WJTL_STATUS_FAILED;
  }
  return WVar10;
}

Assistant:

static
WJTL_STATUS
    TestMarshallStrings
    (
        void
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;

    typedef struct
    {
        char fixedStr[10];
        char* strPtr;
    } StringStruct;

    JlMarshallElement marshalStringStruct[] =
    {
        JlMarshallStringFixed( StringStruct, fixedStr, "fixedStr" ),
        JlMarshallString( StringStruct, strPtr, "strPtr" ),
    };

    StringStruct theStruct = {{0}};
    char* jsonString = NULL;

    // Check marshalling null strings
    JL_ASSERT_SUCCESS( MakeJsonAndVerify( &theStruct, marshalStringStruct, NumElements(marshalStringStruct),
                                          "{\"fixedStr\":null,\"strPtr\":null}" ) );

    // Check with strings
    strcpy( theStruct.fixedStr, "Hello" );
    theStruct.strPtr = "There";
    JL_ASSERT_SUCCESS( MakeJsonAndVerify( &theStruct, marshalStringStruct, NumElements(marshalStringStruct),
                                          "{\"fixedStr\":\"Hello\",\"strPtr\":\"There\"}" ) );

    // try with escaped characters
    theStruct.fixedStr[0] = 0;
    theStruct.strPtr = "\x01\x02\x03\x04\x05\x06\x07\x08\x09\x0a\x0b\x0c\x0d\x0e\0xf";
    JL_ASSERT_SUCCESS( MakeJsonAndVerify( &theStruct, marshalStringStruct, NumElements(marshalStringStruct),
        "{\"fixedStr\":null,\"strPtr\":\"\\u0001\\u0002\\u0003\\u0004\\u0005\\u0006\\u0007\\b\\t\\n\\u000b\\f\\r\\u000e\"}" ) );

    theStruct.strPtr = "\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f";
    JL_ASSERT_SUCCESS( MakeJsonAndVerify( &theStruct, marshalStringStruct, NumElements(marshalStringStruct),
        "{\"fixedStr\":null,\"strPtr\":\"\\u0010\\u0011\\u0012\\u0013\\u0014\\u0015\\u0016\\u0017"
        "\\u0018\\u0019\\u001a\\u001b\\u001c\\u001d\\u001e\\u001f\"}" ) );

    theStruct.strPtr = "_\"_";
    JL_ASSERT_SUCCESS( MakeJsonAndVerify( &theStruct, marshalStringStruct, NumElements(marshalStringStruct),
                       "{\"fixedStr\":null,\"strPtr\":\"_\\\"_\"}" ) );

    theStruct.strPtr = "_\\_";
    JL_ASSERT_SUCCESS( MakeJsonAndVerify( &theStruct, marshalStringStruct, NumElements(marshalStringStruct),
                                          "{\"fixedStr\":null,\"strPtr\":\"_\\\\_\"}" ) );

    theStruct.strPtr = "\xF0\x9F\x98\x81";       // smiley face emoji
    JL_ASSERT_SUCCESS( MakeJsonAndVerify( &theStruct, marshalStringStruct, NumElements(marshalStringStruct),
                                          "{\"fixedStr\":null,\"strPtr\":\"\xF0\x9F\x98\x81\"}" ) );

    // Test invalid utf8 values (truncated)
    theStruct.strPtr = "\xF0\x9F\x98Truncated";
    JL_ASSERT_STATUS( JlStructToJson( &theStruct, marshalStringStruct, NumElements(marshalStringStruct), false, &jsonString ),
                      JL_STATUS_INVALID_DATA );

    return TestReturn;
}